

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O3

InlineResult
soul::Optimisations::inlineNextCall
          (Program *program,Function *parentFunction,Function *functionToInline)

{
  pointer ppVar1;
  bool bVar2;
  FunctionCall *call;
  long lVar3;
  Statement *pSVar4;
  size_t blockIndex;
  
  ppVar1 = (parentFunction->blocks).
           super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(parentFunction->blocks).
                super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    blockIndex = 0;
    do {
      for (pSVar4 = ((ppVar1[blockIndex].object)->statements).firstObject;
          pSVar4 != (Statement *)0x0; pSVar4 = pSVar4->nextObject) {
        call = (FunctionCall *)
               __dynamic_cast(pSVar4,&heart::Statement::typeinfo,&heart::FunctionCall::typeinfo,0);
        if ((call != (FunctionCall *)0x0) && ((call->function).object == functionToInline)) {
          bVar2 = heart::Utilities::canFunctionBeInlined(program,parentFunction,call);
          if (bVar2) {
            makeFunctionCallInline(program,parentFunction,blockIndex,call);
            return ok;
          }
          return failed;
        }
      }
      blockIndex = blockIndex + 1;
    } while (blockIndex != lVar3 + (ulong)(lVar3 == 0));
  }
  return noneFound;
}

Assistant:

static InlineResult inlineNextCall (Program& program, heart::Function& parentFunction, heart::Function& functionToInline)
    {
        for (size_t blockIndex = 0; blockIndex < parentFunction.blocks.size(); ++blockIndex)
        {
            for (auto s : parentFunction.blocks[blockIndex]->statements)
            {
                if (auto call = cast<heart::FunctionCall> (*s))
                {
                    if (call->function == functionToInline)
                    {
                        if (! heart::Utilities::canFunctionBeInlined (program, parentFunction, *call))
                            return InlineResult::failed;

                        makeFunctionCallInline (program, parentFunction, blockIndex, *call);
                        return InlineResult::ok;
                    }
                }
            }
        }

        return InlineResult::noneFound;
    }